

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O1

void Gia_PolynBuildAdd(Pln_Man_t *p,Vec_Int_t *vTempC,Vec_Int_t *vTempM)

{
  size_t sVar1;
  Vec_Flt_t *pVVar2;
  Vec_Que_t *pVVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  float *pfVar7;
  Hsh_VecMan_t *pHVar8;
  int *piVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  
  if (vTempM == (Vec_Int_t *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = Hsh_VecManAdd(p->pHashM,vTempM);
  }
  p->nBuilds = p->nBuilds + 1;
  uVar14 = p->vCoefs->nSize;
  if (uVar5 != uVar14) {
    if (((int)uVar5 < 0) || ((int)uVar14 <= (int)uVar5)) goto LAB_005e068e;
    uVar14 = p->vCoefs->pArray[uVar5];
    uVar13 = (ulong)uVar14;
    if (uVar13 != 0) {
      if ((int)uVar14 < 0) {
LAB_005e068e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pHVar8 = p->pHashC;
      if (pHVar8->vMap->nSize <= (int)uVar14) goto LAB_005e068e;
      iVar6 = pHVar8->vMap->pArray[uVar13];
      if (((long)iVar6 < 0) || (pHVar8->vData->nSize <= iVar6)) {
LAB_005e066f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar9 = pHVar8->vData->pArray + iVar6;
      iVar6 = *piVar9;
      (pHVar8->vTemp).nCap = iVar6;
      (pHVar8->vTemp).nSize = iVar6;
      (pHVar8->vTemp).pArray = piVar9 + 2;
      if (0 < iVar6) {
        lVar17 = 0;
        do {
          Gia_PolynMergeConstOne(vTempC,(pHVar8->vTemp).pArray[lVar17]);
          pHVar8 = p->pHashC;
          if (pHVar8->vMap->nSize <= (int)uVar14) goto LAB_005e068e;
          iVar6 = pHVar8->vMap->pArray[uVar13];
          if (((long)iVar6 < 0) || (pHVar8->vData->nSize <= iVar6)) goto LAB_005e066f;
          piVar9 = pHVar8->vData->pArray + iVar6;
          iVar6 = *piVar9;
          (pHVar8->vTemp).nCap = iVar6;
          (pHVar8->vTemp).nSize = iVar6;
          (pHVar8->vTemp).pArray = piVar9 + 2;
          lVar17 = lVar17 + 1;
        } while (lVar17 < iVar6);
      }
    }
    iVar6 = Hsh_VecManAdd(p->pHashC,vTempC);
    if (p->vCoefs->nSize <= (int)uVar5) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    p->vCoefs->pArray[uVar5] = iVar6;
    iVar10 = -1;
    if ((uVar13 == 0 || iVar6 != 0) && (iVar10 = 1, uVar13 != 0 || iVar6 == 0)) {
      return;
    }
    goto LAB_005e065d;
  }
  iVar6 = Hsh_VecManAdd(p->pHashC,vTempC);
  Vec_IntPush(p->vCoefs,iVar6);
  if ((long)vTempM->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1f8,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  iVar10 = vTempM->pArray[(long)vTempM->nSize + -1];
  if (((long)iVar10 < 0) || (p->vOrder->nSize <= iVar10)) goto LAB_005e068e;
  iVar10 = p->vOrder->pArray[iVar10];
  pVVar2 = p->vCounts;
  uVar14 = pVVar2->nCap;
  if (pVVar2->nSize == uVar14) {
    if ((int)uVar14 < 0x10) {
      if (pVVar2->pArray == (float *)0x0) {
        pfVar7 = (float *)malloc(0x40);
      }
      else {
        pfVar7 = (float *)realloc(pVVar2->pArray,0x40);
      }
      pVVar2->pArray = pfVar7;
      iVar16 = 0x10;
    }
    else {
      iVar16 = uVar14 * 2;
      if (iVar16 <= (int)uVar14) goto LAB_005e0404;
      if (pVVar2->pArray == (float *)0x0) {
        pfVar7 = (float *)malloc((ulong)uVar14 << 3);
      }
      else {
        pfVar7 = (float *)realloc(pVVar2->pArray,(ulong)uVar14 << 3);
      }
      pVVar2->pArray = pfVar7;
    }
    pVVar2->nCap = iVar16;
  }
LAB_005e0404:
  iVar16 = pVVar2->nSize;
  pVVar2->nSize = iVar16 + 1;
  pVVar2->pArray[iVar16] = (float)iVar10;
  pVVar3 = p->vQue;
  iVar10 = pVVar3->nCap;
  if (iVar10 <= pVVar3->nSize) {
    iVar11 = pVVar3->nSize + 1;
    iVar16 = iVar10 * 2;
    if (iVar11 == iVar16 || SBORROW4(iVar11,iVar16) != iVar11 + iVar10 * -2 < 0) {
      iVar11 = iVar16;
    }
    if (iVar10 < iVar11) {
      lVar17 = (long)iVar11;
      sVar1 = lVar17 * 4;
      if (pVVar3->pHeap == (int *)0x0) {
        piVar9 = (int *)malloc(sVar1);
      }
      else {
        piVar9 = (int *)realloc(pVVar3->pHeap,sVar1);
      }
      pVVar3->pHeap = piVar9;
      if (pVVar3->pOrder == (int *)0x0) {
        piVar9 = (int *)malloc(sVar1);
      }
      else {
        piVar9 = (int *)realloc(pVVar3->pOrder,sVar1);
      }
      pVVar3->pOrder = piVar9;
      memset(pVVar3->pHeap + pVVar3->nCap,0xff,(lVar17 - pVVar3->nCap) * 4);
      memset(pVVar3->pOrder + pVVar3->nCap,0xff,(lVar17 - pVVar3->nCap) * 4);
      pVVar3->nCap = iVar11;
    }
  }
  iVar10 = pVVar3->nCap;
  if (iVar10 <= (int)uVar5) {
    iVar16 = uVar5 + 1;
    iVar11 = iVar10 * 2;
    if (iVar16 != iVar11 && SBORROW4(iVar16,iVar11) == iVar16 + iVar10 * -2 < 0) {
      iVar11 = iVar16;
    }
    if (iVar10 < iVar11) {
      lVar17 = (long)iVar11;
      sVar1 = lVar17 * 4;
      if (pVVar3->pHeap == (int *)0x0) {
        piVar9 = (int *)malloc(sVar1);
      }
      else {
        piVar9 = (int *)realloc(pVVar3->pHeap,sVar1);
      }
      pVVar3->pHeap = piVar9;
      if (pVVar3->pOrder == (int *)0x0) {
        piVar9 = (int *)malloc(sVar1);
      }
      else {
        piVar9 = (int *)realloc(pVVar3->pOrder,sVar1);
      }
      pVVar3->pOrder = piVar9;
      memset(pVVar3->pHeap + pVVar3->nCap,0xff,(lVar17 - pVVar3->nCap) * 4);
      memset(pVVar3->pOrder + pVVar3->nCap,0xff,(lVar17 - pVVar3->nCap) * 4);
      pVVar3->nCap = iVar11;
    }
  }
  iVar10 = pVVar3->nSize;
  if (pVVar3->nCap <= iVar10) {
    __assert_fail("p->nSize < p->nCap",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                  ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
  }
  piVar9 = pVVar3->pOrder;
  if (piVar9[(int)uVar5] != -1) {
    __assert_fail("p->pOrder[v] == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                  ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
  }
  piVar4 = pVVar3->pHeap;
  if (piVar4[iVar10] != -1) {
    __assert_fail("p->pHeap[p->nSize] == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                  ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
  }
  piVar9[(int)uVar5] = iVar10;
  iVar10 = pVVar3->nSize;
  pVVar3->nSize = iVar10 + 1;
  piVar4[iVar10] = uVar5;
  pfVar7 = *pVVar3->pCostsFlt;
  if (pfVar7 == (float *)0x0) {
    fVar18 = (float)(int)uVar5;
  }
  else {
    fVar18 = pfVar7[(int)uVar5];
  }
  uVar14 = piVar9[(int)uVar5];
  uVar13 = (ulong)(int)uVar14;
  if (uVar13 == 0xffffffffffffffff) {
    __assert_fail("p->pOrder[v] != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                  ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
  }
  if (piVar4[uVar13] != uVar5) {
    __assert_fail("p->pHeap[i] == v",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                  ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
  }
  if (1 < (int)uVar14) {
    uVar15 = (ulong)uVar14;
    do {
      uVar12 = (uint)uVar13;
      uVar15 = uVar15 >> 1;
      iVar10 = piVar4[uVar15];
      if (pfVar7 == (float *)0x0) {
        fVar19 = (float)iVar10;
      }
      else {
        fVar19 = pfVar7[iVar10];
      }
      uVar14 = uVar12;
      if (fVar18 <= fVar19) break;
      piVar4[uVar13 & 0xffffffff] = iVar10;
      piVar9[iVar10] = uVar12;
      uVar13 = uVar15;
      uVar14 = (uint)uVar15;
    } while (3 < uVar12);
  }
  piVar4[(int)uVar14] = uVar5;
  piVar9[(int)uVar5] = uVar14;
  iVar10 = 1;
  if (iVar6 == 0) {
    return;
  }
LAB_005e065d:
  p->nUsed = p->nUsed + iVar10;
  return;
}

Assistant:

static inline void Gia_PolynBuildAdd( Pln_Man_t * p, Vec_Int_t * vTempC, Vec_Int_t * vTempM )
{
    int iConst, iConstNew, iMono = vTempM ? Hsh_VecManAdd(p->pHashM, vTempM) : 0;
    p->nBuilds++;
    if ( iMono == Vec_IntSize(p->vCoefs) ) // new monomial
    {
        iConst = Hsh_VecManAdd( p->pHashC, vTempC );
        Vec_IntPush( p->vCoefs, iConst );
//        Vec_FltPush( p->vCounts, Vec_IntEntryLast(vTempM) );
        Vec_FltPush( p->vCounts, (float)Vec_IntEntry(p->vOrder, Vec_IntEntryLast(vTempM)) );
        Vec_QuePush( p->vQue, iMono );
//        Vec_QueUpdate( p->vQue, iMono );
        if ( iConst )
            p->nUsed++;
        return;
    }
    // this monomial exists
    iConst = Vec_IntEntry( p->vCoefs, iMono );
    if ( iConst )
        Gia_PolynMergeConst( vTempC, p, iConst );
    iConstNew = Hsh_VecManAdd( p->pHashC, vTempC );
    Vec_IntWriteEntry( p->vCoefs, iMono, iConstNew );
    if ( iConst && !iConstNew )
        p->nUsed--;
    else if ( !iConst && iConstNew )
        p->nUsed++;
    //assert( p->nUsed == Vec_IntSize(p->vCoefs) - Vec_IntCountZero(p->vCoefs) );
}